

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setMaximumSignificantDigits(DecimalFormat *this,int32_t value)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->maximumSignificantDigits == value) {
    return;
  }
  if (value < pDVar1->minimumSignificantDigits && -1 < pDVar1->minimumSignificantDigits) {
    pDVar1->minimumSignificantDigits = value;
  }
  pDVar1->maximumSignificantDigits = value;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMaximumSignificantDigits(int32_t value) {
    if (value == fields->properties->maximumSignificantDigits) { return; }
    int32_t min = fields->properties->minimumSignificantDigits;
    if (min >= 0 && min > value) {
        fields->properties->minimumSignificantDigits = value;
    }
    fields->properties->maximumSignificantDigits = value;
    touchNoError();
}